

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

xmlEntityPtr getEntityDebug(void *ctx,xmlChar *name)

{
  xmlEntityPtr pxVar1;
  
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.getEntity(%s)\n",name);
  pxVar1 = (xmlEntityPtr)xmlHashLookup(*(undefined8 *)((long)ctx + 8),name);
  return pxVar1;
}

Assistant:

static xmlEntityPtr
getEntityDebug(void *ctx, const xmlChar *name)
{
    debugContext *ctxt = ctx;

    callbacks++;
    if (quiet)
	return(NULL);
    fprintf(SAXdebug, "SAX.getEntity(%s)\n", name);

    return(xmlHashLookup(ctxt->generalEntities, name));
}